

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O1

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::initParameters
          (NonIterativeFeaturePreservingMeshFiltering *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParameterSet *pPVar2;
  string local_40;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sigma_f/mean_edge_length","")
  ;
  ParameterSet::addParameter(pPVar2,&local_40,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sigma_g/mean_edge_length","")
  ;
  ParameterSet::addParameter(pPVar2,&local_40,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::initParameters()
{
    parameter_set_->removeAllParameter();
    parameter_set_->addParameter(string("sigma_f/mean_edge_length"), 1.0);
    parameter_set_->addParameter(string("sigma_g/mean_edge_length"), 1.0);

}